

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transform.cc
# Opt level: O0

void __thiscall
pass_decouple_generator_ports_Test::TestBody(pass_decouple_generator_ports_Test *this)

{
  bool bVar1;
  Generator *pGVar2;
  Port *pPVar3;
  PassManager *pPVar4;
  char *message;
  AssertHelper local_588;
  Message local_580;
  int local_574;
  size_type local_570;
  undefined1 local_568 [8];
  AssertionResult gtest_ar;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  src;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  PassManager *local_460;
  PassManager *manager;
  VerilogModule verilog;
  shared_ptr<kratos::Stmt> local_3f0;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  enable_shared_from_this<kratos::Generator> local_3a0;
  allocator<char> local_389;
  string local_388;
  enable_shared_from_this<kratos::Generator> local_368;
  allocator<char> local_351;
  string local_350;
  undefined1 local_330 [39];
  allocator<char> local_309;
  string local_308;
  Port *local_2e8;
  Port *out3;
  string local_2d8;
  __node_base local_2b8;
  Port *in3;
  string local_2a8;
  Generator *local_288;
  Generator *mod3;
  shared_ptr<kratos::Stmt> local_270;
  allocator<char> local_259;
  string local_258;
  Port *local_238;
  Port *out2;
  string local_228;
  undefined8 local_208;
  Port *in2;
  string local_1f8;
  Generator *local_1d8;
  Generator *mod2;
  string local_1c8;
  Port *local_1a8;
  Port *out1;
  string local_198;
  undefined8 local_178;
  Port *in1;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod1;
  Context c;
  pass_decouple_generator_ports_Test *this_local;
  
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"module1",&local_159);
  pGVar2 = kratos::Context::generator((Context *)&mod1,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"in",(allocator<char> *)((long)&out1 + 7));
  pPVar3 = kratos::Generator::port(pGVar2,In,&local_198,1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&out1 + 7));
  pGVar2 = local_138;
  local_178 = pPVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"out",(allocator<char> *)((long)&mod2 + 7));
  pPVar3 = kratos::Generator::port(pGVar2,Out,&local_1c8,1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&mod2 + 7));
  local_1a8 = pPVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"module2",(allocator<char> *)((long)&in2 + 7));
  pGVar2 = kratos::Context::generator((Context *)&mod1,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in2 + 7));
  local_1d8 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"in",(allocator<char> *)((long)&out2 + 7));
  pPVar3 = kratos::Generator::port(pGVar2,In,&local_228,1);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)((long)&out2 + 7));
  pGVar2 = local_1d8;
  local_208 = pPVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"out",&local_259);
  pPVar3 = kratos::Generator::port(pGVar2,Out,&local_258,1);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  pGVar2 = local_1d8;
  local_238 = pPVar3;
  kratos::Var::assign((Var *)&mod3,&pPVar3->super_Var,(AssignmentType)local_208);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_270,(shared_ptr<kratos::AssignStmt> *)&mod3);
  kratos::Generator::add_stmt(pGVar2,&local_270);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_270);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)&mod3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"module3",(allocator<char> *)((long)&in3 + 7));
  pGVar2 = kratos::Context::generator((Context *)&mod1,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in3 + 7));
  local_288 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"in",(allocator<char> *)((long)&out3 + 7));
  pPVar3 = kratos::Generator::port(pGVar2,In,&local_2d8,1);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&out3 + 7));
  pGVar2 = local_288;
  local_2b8._M_nxt = (_Hash_node_base *)pPVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"out",&local_309);
  pPVar3 = kratos::Generator::port(pGVar2,Out,&local_308,1);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  pGVar2 = local_288;
  local_2e8 = pPVar3;
  kratos::Var::assign((Var *)local_330,&pPVar3->super_Var,(AssignmentType)local_2b8._M_nxt);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_330 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_330);
  kratos::Generator::add_stmt(pGVar2,(shared_ptr<kratos::Stmt> *)(local_330 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_330 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_330);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"inst0",&local_351);
  std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_368);
  kratos::Generator::add_child_generator
            (pGVar2,&local_350,(shared_ptr<kratos::Generator> *)&local_368);
  std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&local_368);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"inst1",&local_389);
  std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_3a0);
  kratos::Generator::add_child_generator
            (pGVar2,&local_388,(shared_ptr<kratos::Generator> *)&local_3a0);
  std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  pGVar2 = local_138;
  kratos::Var::assign((Var *)local_3c0,(Var *)local_208);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_3c0 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_3c0);
  kratos::Generator::add_stmt(pGVar2,(shared_ptr<kratos::Stmt> *)(local_3c0 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_3c0 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_3c0);
  pGVar2 = local_138;
  kratos::Var::assign((Var *)local_3e0,(Var *)local_2b8._M_nxt);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_3e0 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_3e0);
  kratos::Generator::add_stmt(pGVar2,(shared_ptr<kratos::Stmt> *)(local_3e0 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_3e0 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_3e0);
  pGVar2 = local_138;
  pPVar3 = local_1a8;
  kratos::Var::operator+(&local_238->super_Var,&local_2e8->super_Var);
  kratos::Var::assign((Var *)&verilog.manager_.collect_perf_,&pPVar3->super_Var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_3f0,(shared_ptr<kratos::AssignStmt> *)&verilog.manager_.collect_perf_);
  kratos::Generator::add_stmt(pGVar2,&local_3f0);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_3f0);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr
            ((shared_ptr<kratos::AssignStmt> *)&verilog.manager_.collect_perf_);
  kratos::VerilogModule::VerilogModule((VerilogModule *)&manager,local_138);
  pPVar4 = kratos::VerilogModule::pass_manager((VerilogModule *)&manager);
  local_460 = pPVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"fix_assignment_type",&local_481);
  kratos::PassManager::add_pass(pPVar4,&local_480);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  pPVar4 = local_460;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,"decouple_generator_ports",&local_4a9);
  kratos::PassManager::add_pass(pPVar4,&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  pPVar4 = local_460;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d0,"check_mixed_assignment",&local_4d1);
  kratos::PassManager::add_pass(pPVar4,&local_4d0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  pPVar4 = local_460;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,"create_module_instantiation",&local_4f9);
  kratos::PassManager::add_pass(pPVar4,&local_4f8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  pPVar4 = local_460;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_520,"hash_generators_parallel",
             (allocator<char> *)((long)&src._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  kratos::PassManager::add_pass(pPVar4,&local_520);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&src._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  kratos::VerilogModule::run_passes((VerilogModule *)&manager);
  kratos::VerilogModule::verilog_src_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar.message_,(VerilogModule *)&manager);
  local_570 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&gtest_ar.message_);
  local_574 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_568,"src.size()","3",&local_570,&local_574);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_568);
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_transform.cc"
               ,0x70,message);
    testing::internal::AssertHelper::operator=(&local_588,&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&gtest_ar.message_);
  kratos::VerilogModule::~VerilogModule((VerilogModule *)&manager);
  kratos::Context::~Context((Context *)&mod1);
  return;
}

Assistant:

TEST(pass, decouple_generator_ports) {  // NOLINT
    Context c;
    auto &mod1 = c.generator("module1");
    auto &in1 = mod1.port(PortDirection::In, "in", 1);
    auto &out1 = mod1.port(PortDirection::Out, "out", 1);

    auto &mod2 = c.generator("module2");
    auto &in2 = mod2.port(PortDirection::In, "in", 1);
    auto &out2 = mod2.port(PortDirection::Out, "out", 1);
    mod2.add_stmt(out2.assign(in2, AssignmentType::Blocking));

    auto &mod3 = c.generator("module3");
    auto &in3 = mod3.port(PortDirection::In, "in", 1);
    auto &out3 = mod3.port(PortDirection::Out, "out", 1);
    mod3.add_stmt(out3.assign(in3, AssignmentType::Blocking));

    mod1.add_child_generator("inst0", mod2.shared_from_this());
    mod1.add_child_generator("inst1", mod3.shared_from_this());

    mod1.add_stmt(in2.assign(in1));
    mod1.add_stmt(in3.assign(in1));

    mod1.add_stmt(out1.assign(out2 + out3));

    VerilogModule verilog(&mod1);
    PassManager &manager = verilog.pass_manager();
    manager.add_pass("fix_assignment_type");
    manager.add_pass("decouple_generator_ports");
    manager.add_pass("check_mixed_assignment");
    manager.add_pass("create_module_instantiation");
    manager.add_pass("hash_generators_parallel");
    verilog.run_passes();
    auto src = verilog.verilog_src();
    EXPECT_EQ(src.size(), 3);
}